

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix * __thiscall Matrix::mulew(Matrix *this,Matrix *mat)

{
  double dVar1;
  bool bVar2;
  const_reference this_00;
  const_reference pvVar3;
  reference this_01;
  reference pvVar4;
  uint local_20;
  uint local_1c;
  uint j;
  uint i;
  Matrix *mat_local;
  Matrix *this_local;
  
  bVar2 = Shape::operator!=(&this->m_shape,&mat->m_shape);
  if (!bVar2) {
    for (local_1c = 0; local_1c < (this->m_shape).field_0.m_dims[0]; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 < (this->m_shape).field_0.m_dims[1]; local_20 = local_20 + 1) {
        this_00 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&mat->m_vals,(ulong)local_1c);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(ulong)local_20);
        dVar1 = *pvVar3;
        this_01 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&this->m_vals,(ulong)local_1c);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(ulong)local_20);
        *pvVar4 = dVar1 * *pvVar4;
      }
    }
    return this;
  }
  std::operator<<((ostream *)&std::cout,
                  "ERROR [element-wise multiplication]: Shapes don\'t match!\n");
  exit(1);
}

Assistant:

Matrix& Matrix::mulew(const Matrix& mat){
    if(m_shape!=mat.m_shape){
        std::cout<<"ERROR [element-wise multiplication]: Shapes don't match!\n";
        exit(1);
    }

    for(uint i=0;i<m_shape.n_row;++i){
        for(uint j=0;j<m_shape.n_col;++j){
            m_vals[i][j]*=mat.m_vals[i][j];
        }
    }
    return *this;
}